

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * doctest::toString(String *__return_storage_ptr__,double in)

{
  long *__src;
  long lVar1;
  size_t sVar2;
  char *__dest;
  string d;
  ostringstream oss;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  double local_1b8;
  long *local_1b0 [2];
  long local_1a0 [2];
  long local_190;
  undefined8 local_188 [2];
  uint auStack_178 [22];
  ios_base local_120 [264];
  
  local_1b8 = in;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 10;
  *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) & 0xfffffefb | 4;
  std::ostream::_M_insert<double>(local_1b8);
  std::__cxx11::stringbuf::str();
  lVar1 = std::__cxx11::string::find_last_not_of((char)&local_1d8,0x30);
  if ((lVar1 != -1) && (lVar1 != local_1d0 + -1)) {
    std::__cxx11::string::substr((ulong)local_1b0,(ulong)&local_1d8);
    std::__cxx11::string::operator=((string *)&local_1d8,(string *)local_1b0);
    if (local_1b0[0] != local_1a0) {
      operator_delete(local_1b0[0],local_1a0[0] + 1);
    }
  }
  __src = local_1d8;
  sVar2 = strlen((char *)local_1d8);
  __dest = String::allocate(__return_storage_ptr__,(uint)sVar2);
  memcpy(__dest,__src,sVar2 & 0xffffffff);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

String toString(double in) { return fpToString(in, 10); }